

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

int mu_pool_init(mu_Context *ctx,mu_PoolItem *items,int len,mu_Id id)

{
  int local_2c;
  uint local_28;
  int f;
  int n;
  int i;
  mu_Id id_local;
  int len_local;
  mu_PoolItem *items_local;
  mu_Context *ctx_local;
  
  local_28 = 0xffffffff;
  local_2c = ctx->frame;
  for (f = 0; f < len; f = f + 1) {
    if (items[f].last_update < local_2c) {
      local_2c = items[f].last_update;
      local_28 = f;
    }
  }
  if (0x7fffffff < local_28) {
    fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
            "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
            ,0x162,"n > -1");
    abort();
  }
  items[(int)local_28].id = id;
  mu_pool_update(ctx,items,local_28);
  return local_28;
}

Assistant:

int mu_pool_init(mu_Context *ctx, mu_PoolItem *items, int len, mu_Id id) {
  int i, n = -1, f = ctx->frame;
  for (i = 0; i < len; i++) {
    if (items[i].last_update < f) {
      f = items[i].last_update;
      n = i;
    }
  }
  expect(n > -1);
  items[n].id = id;
  mu_pool_update(ctx, items, n);
  return n;
}